

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistPhraseMerge(char **pp,int nToken,int isSaveLeft,int isExact,char **pp1,char **pp2)

{
  int iVar1;
  char *pcVar2;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  long local_90;
  int local_88;
  int local_84;
  sqlite3_int64 iSave;
  sqlite3_int64 iPos2;
  sqlite3_int64 iPos1;
  sqlite3_int64 iPrev;
  char *pSave;
  int iCol2;
  int iCol1;
  char *p2;
  char *p1;
  char *p;
  char **pp2_local;
  char **pp1_local;
  int local_20;
  int isExact_local;
  int isSaveLeft_local;
  int nToken_local;
  char **pp_local;
  
  p1 = *pp;
  p2 = *pp1;
  _iCol2 = (byte *)*pp2;
  pSave._4_4_ = 0;
  pSave._0_4_ = 0;
  p = (char *)pp2;
  pp2_local = pp1;
  pp1_local._4_4_ = isExact;
  local_20 = isSaveLeft;
  isExact_local = nToken;
  _isSaveLeft_local = pp;
  if (*p2 == '\x01') {
    p2 = p2 + 1;
    if ((*p2 & 0x80U) == 0) {
      pSave._4_4_ = (uint)(byte)*p2;
      local_84 = 1;
    }
    else {
      local_84 = sqlite3Fts3GetVarint32(p2,(int *)((long)&pSave + 4));
    }
    p2 = p2 + local_84;
  }
  if (*_iCol2 == 1) {
    _iCol2 = _iCol2 + 1;
    if ((*_iCol2 & 0x80) == 0) {
      pSave._0_4_ = (uint)*_iCol2;
      local_88 = 1;
    }
    else {
      local_88 = sqlite3Fts3GetVarint32((char *)_iCol2,(int *)&pSave);
    }
    _iCol2 = _iCol2 + local_88;
  }
  while( true ) {
    while (pSave._4_4_ != (uint)pSave) {
      if ((int)pSave._4_4_ < (int)(uint)pSave) {
        fts3ColumnlistCopy((char **)0x0,&p2);
        if (*p2 == '\0') goto LAB_002216f7;
        p2 = p2 + 1;
        if ((*p2 & 0x80U) == 0) {
          pSave._4_4_ = (uint)(byte)*p2;
          local_9c = 1;
        }
        else {
          local_9c = sqlite3Fts3GetVarint32(p2,(int *)((long)&pSave + 4));
        }
        p2 = p2 + local_9c;
      }
      else {
        fts3ColumnlistCopy((char **)0x0,(char **)&iCol2);
        if (*_iCol2 == 0) goto LAB_002216f7;
        _iCol2 = _iCol2 + 1;
        if ((*_iCol2 & 0x80) == 0) {
          pSave._0_4_ = (uint)*_iCol2;
          local_a0 = 1;
        }
        else {
          local_a0 = sqlite3Fts3GetVarint32((char *)_iCol2,(int *)&pSave);
        }
        _iCol2 = _iCol2 + local_a0;
      }
    }
    iPrev = (sqlite3_int64)p1;
    iPos1 = 0;
    iPos2 = 0;
    iSave = 0;
    if (pSave._4_4_ != 0) {
      pcVar2 = p1 + 1;
      *p1 = '\x01';
      p1 = pcVar2;
      iVar1 = sqlite3Fts3PutVarint(pcVar2,(long)(int)pSave._4_4_);
      p1 = p1 + iVar1;
    }
    fts3GetDeltaVarint(&p2,&iPos2);
    iPos2 = iPos2 + -2;
    fts3GetDeltaVarint((char **)&iCol2,&iSave);
    iSave = iSave + -2;
    if ((iPos2 < 0) || (iSave < 0)) break;
    while( true ) {
      while( true ) {
        if ((iSave == iPos2 + isExact_local) ||
           (((pp1_local._4_4_ == 0 && (iPos2 < iSave)) && (iSave <= iPos2 + isExact_local)))) {
          if (local_20 == 0) {
            local_90 = iSave;
          }
          else {
            local_90 = iPos2;
          }
          fts3PutDeltaVarint(&p1,&iPos1,local_90 + 2);
          iPos1 = iPos1 + -2;
          iPrev = 0;
        }
        if (((local_20 != 0) || (iPos2 + isExact_local < iSave)) && (iPos2 < iSave)) break;
        if (((int)(char)*_iCol2 & 0xfeU) == 0) goto LAB_002214f2;
        fts3GetDeltaVarint((char **)&iCol2,&iSave);
        iSave = iSave + -2;
      }
      if (((int)*p2 & 0xfeU) == 0) break;
      fts3GetDeltaVarint(&p2,&iPos2);
      iPos2 = iPos2 + -2;
    }
LAB_002214f2:
    if (iPrev != 0) {
      p1 = (char *)iPrev;
    }
    fts3ColumnlistCopy((char **)0x0,&p2);
    fts3ColumnlistCopy((char **)0x0,(char **)&iCol2);
    if ((*p2 == '\0') || (*_iCol2 == 0)) break;
    p2 = p2 + 1;
    if ((*p2 & 0x80U) == 0) {
      pSave._4_4_ = (uint)(byte)*p2;
      local_94 = 1;
    }
    else {
      local_94 = sqlite3Fts3GetVarint32(p2,(int *)((long)&pSave + 4));
    }
    p2 = p2 + local_94;
    _iCol2 = _iCol2 + 1;
    if ((*_iCol2 & 0x80) == 0) {
      pSave._0_4_ = (uint)*_iCol2;
      local_98 = 1;
    }
    else {
      local_98 = sqlite3Fts3GetVarint32((char *)_iCol2,(int *)&pSave);
    }
    _iCol2 = _iCol2 + local_98;
  }
LAB_002216f7:
  fts3PoslistCopy((char **)0x0,(char **)&iCol2);
  fts3PoslistCopy((char **)0x0,&p2);
  *pp2_local = p2;
  *(byte **)p = _iCol2;
  pcVar2 = *_isSaveLeft_local;
  if (pcVar2 != p1) {
    *p1 = '\0';
    *_isSaveLeft_local = p1 + 1;
  }
  pp_local._4_4_ = (uint)(pcVar2 != p1);
  return pp_local._4_4_;
}

Assistant:

static int fts3PoslistPhraseMerge(
  char **pp,                      /* IN/OUT: Preallocated output buffer */
  int nToken,                     /* Maximum difference in token positions */
  int isSaveLeft,                 /* Save the left position */
  int isExact,                    /* If *pp1 is exactly nTokens before *pp2 */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p = *pp;
  char *p1 = *pp1;
  char *p2 = *pp2;
  int iCol1 = 0;
  int iCol2 = 0;

  /* Never set both isSaveLeft and isExact for the same invocation. */
  assert( isSaveLeft==0 || isExact==0 );

  assert( p!=0 && *p1!=0 && *p2!=0 );
  if( *p1==POS_COLUMN ){ 
    p1++;
    p1 += fts3GetVarint32(p1, &iCol1);
  }
  if( *p2==POS_COLUMN ){ 
    p2++;
    p2 += fts3GetVarint32(p2, &iCol2);
  }

  while( 1 ){
    if( iCol1==iCol2 ){
      char *pSave = p;
      sqlite3_int64 iPrev = 0;
      sqlite3_int64 iPos1 = 0;
      sqlite3_int64 iPos2 = 0;

      if( iCol1 ){
        *p++ = POS_COLUMN;
        p += sqlite3Fts3PutVarint(p, iCol1);
      }

      fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
      fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
      if( iPos1<0 || iPos2<0 ) break;

      while( 1 ){
        if( iPos2==iPos1+nToken 
         || (isExact==0 && iPos2>iPos1 && iPos2<=iPos1+nToken) 
        ){
          sqlite3_int64 iSave;
          iSave = isSaveLeft ? iPos1 : iPos2;
          fts3PutDeltaVarint(&p, &iPrev, iSave+2); iPrev -= 2;
          pSave = 0;
          assert( p );
        }
        if( (!isSaveLeft && iPos2<=(iPos1+nToken)) || iPos2<=iPos1 ){
          if( (*p2&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p2, &iPos2); iPos2 -= 2;
        }else{
          if( (*p1&0xFE)==0 ) break;
          fts3GetDeltaVarint(&p1, &iPos1); iPos1 -= 2;
        }
      }

      if( pSave ){
        assert( pp && p );
        p = pSave;
      }

      fts3ColumnlistCopy(0, &p1);
      fts3ColumnlistCopy(0, &p2);
      assert( (*p1&0xFE)==0 && (*p2&0xFE)==0 );
      if( 0==*p1 || 0==*p2 ) break;

      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }

    /* Advance pointer p1 or p2 (whichever corresponds to the smaller of
    ** iCol1 and iCol2) so that it points to either the 0x00 that marks the
    ** end of the position list, or the 0x01 that precedes the next 
    ** column-number in the position list. 
    */
    else if( iCol1<iCol2 ){
      fts3ColumnlistCopy(0, &p1);
      if( 0==*p1 ) break;
      p1++;
      p1 += fts3GetVarint32(p1, &iCol1);
    }else{
      fts3ColumnlistCopy(0, &p2);
      if( 0==*p2 ) break;
      p2++;
      p2 += fts3GetVarint32(p2, &iCol2);
    }
  }

  fts3PoslistCopy(0, &p2);
  fts3PoslistCopy(0, &p1);
  *pp1 = p1;
  *pp2 = p2;
  if( *pp==p ){
    return 0;
  }
  *p++ = 0x00;
  *pp = p;
  return 1;
}